

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O2

Info * __thiscall wabt::Opcode::GetInfo(Info *__return_storage_ptr__,Opcode *this)

{
  Enum EVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined3 uVar8;
  undefined8 uVar9;
  uint32_t uVar10;
  long lVar11;
  uint code;
  uint8_t prefix;
  
  uVar5 = infos_._16424_8_;
  uVar4 = infos_._16408_8_;
  uVar2 = infos_._16400_8_;
  EVar1 = this->enum_;
  if ((ulong)EVar1 < 0x19a) {
    lVar11 = (ulong)EVar1 * 0x28;
    uVar2 = *(undefined8 *)(infos_ + lVar11 + 0x20);
    __return_storage_ptr__->code = (int)uVar2;
    __return_storage_ptr__->prefix_code = (int)((ulong)uVar2 >> 0x20);
    pcVar3 = *(char **)(infos_ + lVar11);
    uVar2 = *(undefined8 *)(infos_ + lVar11 + 8);
    uVar4 = *(undefined8 *)(infos_ + lVar11 + 0x10);
    uVar5 = *(undefined8 *)(infos_ + lVar11 + 0x18);
    __return_storage_ptr__->param2_type = (int)uVar4;
    __return_storage_ptr__->param3_type = (int)((ulong)uVar4 >> 0x20);
    __return_storage_ptr__->memory_size = (int)uVar5;
    __return_storage_ptr__->prefix = (char)((ulong)uVar5 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x1d = (int3)((ulong)uVar5 >> 0x28);
    __return_storage_ptr__->name = pcVar3;
    __return_storage_ptr__->result_type = (int)uVar2;
    __return_storage_ptr__->param1_type = (int)((ulong)uVar2 >> 0x20);
  }
  else {
    uVar6 = infos_._16420_4_;
    __return_storage_ptr__->param2_type = infos_._16416_4_;
    uVar9 = infos_._16424_8_;
    __return_storage_ptr__->param3_type = uVar6;
    infos_._16424_4_ = (undefined4)uVar5;
    infos_[0x402c] = SUB81(uVar5,4);
    uVar7 = infos_[0x402c];
    infos_._16429_3_ = SUB83(uVar5,5);
    uVar8 = infos_._16429_3_;
    __return_storage_ptr__->memory_size = infos_._16424_4_;
    infos_._16424_8_ = uVar9;
    __return_storage_ptr__->prefix = uVar7;
    *(undefined3 *)&__return_storage_ptr__->field_0x1d = uVar8;
    __return_storage_ptr__->name = (char *)uVar2;
    uVar2 = infos_._16408_8_;
    infos_._16408_4_ = (undefined4)uVar4;
    infos_._16412_4_ = SUB84(uVar4,4);
    uVar6 = infos_._16412_4_;
    __return_storage_ptr__->result_type = infos_._16408_4_;
    infos_._16408_8_ = uVar2;
    __return_storage_ptr__->param1_type = uVar6;
    prefix = (uint8_t)(-EVar1 >> 8);
    __return_storage_ptr__->prefix = prefix;
    code = -EVar1 & 0xff;
    __return_storage_ptr__->code = code;
    uVar10 = PrefixCode(prefix,code);
    __return_storage_ptr__->prefix_code = uVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}